

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadPerspectiveCamera(XMLLoader *this,Ref<embree::XML> *xml)

{
  string *psVar1;
  XML *this_00;
  PerspectiveCameraNode *this_01;
  undefined8 *in_RDX;
  Vec3fa up;
  Vec3fa to;
  Vec3fa from;
  allocator local_71;
  string local_70;
  float local_4c;
  undefined1 local_48 [16];
  undefined1 local_38 [32];
  
  psVar1 = (string *)*in_RDX;
  std::__cxx11::string::string((string *)&local_70,"from",(allocator *)local_38);
  XML::parm_Vec3fa((XML *)(local_38 + 0x10),psVar1);
  std::__cxx11::string::~string((string *)&local_70);
  psVar1 = (string *)*in_RDX;
  std::__cxx11::string::string((string *)&local_70,"to",(allocator *)local_48);
  XML::parm_Vec3fa((XML *)local_38,psVar1);
  std::__cxx11::string::~string((string *)&local_70);
  psVar1 = (string *)*in_RDX;
  std::__cxx11::string::string((string *)&local_70,"up",&local_71);
  XML::parm_Vec3fa((XML *)local_48,psVar1);
  std::__cxx11::string::~string((string *)&local_70);
  this_00 = (XML *)*in_RDX;
  std::__cxx11::string::string((string *)&local_70,"fov",&local_71);
  local_4c = XML::parm_float(this_00,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  this_01 = (PerspectiveCameraNode *)SceneGraph::PerspectiveCameraNode::operator_new(0xb0);
  SceneGraph::PerspectiveCameraNode::PerspectiveCameraNode
            (this_01,(Vec3fa *)(local_38 + 0x10),(Vec3fa *)local_38,(Vec3fa *)local_48,local_4c);
  (this->path).filename._M_dataplus._M_p = (pointer)this_01;
  (**(code **)((long)(this_01->super_Node).super_RefCount._vptr_RefCount + 0x10))(this_01);
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadPerspectiveCamera(const Ref<XML>& xml) 
  {
    const Vec3fa from = xml->parm_Vec3fa("from");
    const Vec3fa to = xml->parm_Vec3fa("to");
    const Vec3fa up = xml->parm_Vec3fa("up");
    const float fov = xml->parm_float("fov");
    return new SceneGraph::PerspectiveCameraNode(from,to,up,fov);
  }